

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

bool sensors_analytics::utils::CheckUtf8Valid(string *str)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  size_type sVar5;
  long lVar6;
  
  lVar3 = (long)(int)str->_M_string_length;
  if (lVar3 < 1) {
    sVar5 = 0;
  }
  else {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    pbVar4 = pbVar2;
    do {
      bVar1 = *pbVar4;
      lVar6 = 1;
      if (((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) && (0x5e < (byte)(bVar1 - 0x20))
         ) {
        if ((byte)(bVar1 + 0x3e) < 0x1e) {
          lVar6 = 2;
          bVar1 = pbVar4[1];
        }
        else if (bVar1 == 0xe0) {
          if ((pbVar4[1] & 0xe0) != 0xa0) {
            return false;
          }
LAB_0010f366:
          lVar6 = 3;
          bVar1 = pbVar4[2];
        }
        else {
          if ((((byte)(bVar1 + 0x1f) < 0xc || (bVar1 & 0xfe) == 0xee) && ((char)pbVar4[1] < -0x40))
             && (lVar6 = 3, (char)pbVar4[2] < -0x40)) goto LAB_0010f2c4;
          if (bVar1 == 0xf0) {
            if (0x2f < (byte)(pbVar4[1] + 0x70)) {
              return false;
            }
          }
          else {
            if (bVar1 == 0xed) {
              if (-0x61 < (char)pbVar4[1]) {
                return false;
              }
              goto LAB_0010f366;
            }
            if ((byte)(bVar1 + 0xf) < 3) {
              if (-0x41 < (char)pbVar4[1]) {
                return false;
              }
            }
            else {
              if (bVar1 != 0xf4) {
                return false;
              }
              if (-0x71 < (char)pbVar4[1]) {
                return false;
              }
            }
          }
          if (-0x41 < (char)pbVar4[2]) {
            return false;
          }
          lVar6 = 4;
          bVar1 = pbVar4[3];
        }
        if (-0x41 < (char)bVar1) {
          return false;
        }
      }
LAB_0010f2c4:
      pbVar4 = pbVar4 + lVar6;
      sVar5 = (long)pbVar4 - (long)pbVar2;
    } while ((long)sVar5 < lVar3);
  }
  return sVar5 == str->_M_string_length;
}

Assistant:

bool CheckUtf8Valid(const string &str) {
  // https://stackoverflow.com/a/1031773
  const unsigned char *bytes = (const unsigned char *) str.data();
  const unsigned char *begin = bytes;
  while (bytes - begin < (int)str.length()) {
    if ((bytes[0] == 0x09 || bytes[0] == 0x0A || bytes[0] == 0x0D ||
        (0x20 <= bytes[0] && bytes[0] <= 0x7E))) {
      bytes += 1;
      continue;
    }
    if (((0xC2 <= bytes[0] && bytes[0] <= 0xDF)
        && (0x80 <= bytes[1] && bytes[1] <= 0xBF))) {
      bytes += 2;
      continue;
    }
    if ((bytes[0] == 0xE0 && (0xA0 <= bytes[1] && bytes[1] <= 0xBF) &&
        (0x80 <= bytes[2] && bytes[2] <= 0xBF)) ||
        (((0xE1 <= bytes[0] && bytes[0] <= 0xEC) || bytes[0] == 0xEE
            || bytes[0] == 0xEF) &&
            (0x80 <= bytes[1] && bytes[1] <= 0xBF)
            && (0x80 <= bytes[2] && bytes[2] <= 0xBF)) ||
        (bytes[0] == 0xED && (0x80 <= bytes[1] && bytes[1] <= 0x9F) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF))) {
      bytes += 3;
      continue;
    }
    if ((bytes[0] == 0xF0 && (0x90 <= bytes[1] && bytes[1] <= 0xBF) &&
        (0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
        (0x80 <= bytes[3] && bytes[3] <= 0xBF)) ||
        ((0xF1 <= bytes[0] && bytes[0] <= 0xF3)
            && (0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF)
            && (0x80 <= bytes[3] && bytes[3] <= 0xBF)) ||
        (bytes[0] == 0xF4 && (0x80 <= bytes[1] && bytes[1] <= 0x8F) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
            (0x80 <= bytes[3] && bytes[3] <= 0xBF))) {
      bytes += 4;
      continue;
    }
    return false;
  }
  return bytes - begin == str.length();
}